

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_0::CWriter::WritePrefixBinaryExpr(CWriter *this,Opcode opcode,char *op)

{
  iterator __position;
  size_t size;
  StackVar *in_RCX;
  char (*in_R8) [3];
  Newline *in_R9;
  Opcode local_74;
  char local_70 [8];
  StackVar local_68;
  StackVar local_60 [2];
  Enum local_50;
  
  local_74.enum_ = opcode.enum_;
  Opcode::GetInfo(&local_74);
  local_60[0].index = 1;
  local_60[0].type.enum_ = local_50;
  local_68.index = 1;
  local_68.type.enum_ = Any;
  local_70[0] = '\0';
  local_70[1] = '\0';
  local_70[2] = '\0';
  local_70[3] = '\0';
  local_70[4] = '\0';
  local_70[5] = '\0';
  local_70[6] = '\0';
  local_70[7] = '\0';
  Write(this,local_60);
  WriteData(this," = ",3);
  size = strlen(op);
  WriteData(this,op,size);
  WriteData(this,"(",1);
  (anonymous_namespace)::CWriter::
  Write<wabt::(anonymous_namespace)::StackVar,char_const(&)[3],wabt::(anonymous_namespace)::StackVar,char_const(&)[3],wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,&local_68,(char (*) [3])local_70,in_RCX,in_R8,in_R9);
  DropTypes(this,2);
  local_60[0].index = local_50;
  __position._M_current =
       (this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<wabt::Type,std::allocator<wabt::Type>>::_M_realloc_insert<wabt::Type_const&>
              ((vector<wabt::Type,std::allocator<wabt::Type>> *)&this->type_stack_,__position,
               (Type *)local_60);
  }
  else {
    (__position._M_current)->enum_ = local_50;
    (this->type_stack_).super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

void CWriter::WritePrefixBinaryExpr(Opcode opcode, const char* op) {
  Type result_type = opcode.GetResultType();
  Write(StackVar(1, result_type), " = ", op, "(", StackVar(1), ", ",
        StackVar(0), ");", Newline());
  DropTypes(2);
  PushType(result_type);
}